

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O3

void __thiscall
NJamSpell::TBloomFilter::TBloomFilter(TBloomFilter *this,uint64_t elements,double falsePositiveRate)

{
  _Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false> _Var1;
  _Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false> this_00;
  double dVar2;
  pointer *__ptr;
  bloom_parameters local_68;
  
  (this->BloomFilter)._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
  .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  local_68._vptr_bloom_parameters = (_func_int **)&PTR__bloom_parameters_00123c28;
  local_68.minimum_size = 1;
  local_68.maximum_size = 0xffffffffffffffff;
  local_68.minimum_number_of_hashes = 1;
  local_68.maximum_number_of_hashes = 0xffffffff;
  local_68.optimal_parameters.number_of_hashes = 0;
  local_68.optimal_parameters.table_size = 0;
  local_68.random_seed = 0x2a;
  local_68.projected_element_count = elements;
  local_68.false_positive_probability = falsePositiveRate;
  bloom_parameters::compute_optimal_parameters(&local_68);
  if ((((local_68.minimum_size <= local_68.maximum_size) &&
       (local_68.minimum_number_of_hashes - 1 < local_68.maximum_number_of_hashes)) &&
      (local_68.projected_element_count != 0)) &&
     ((dVar2 = ABS(local_68.false_positive_probability),
      (0x3fe < (uint)((long)dVar2 + 0xfff0000000000000U >> 0x35) ||
      -1 < (long)local_68.false_positive_probability) &&
      (dVar2 != INFINITY &&
      (0xffffffffffffe < (long)dVar2 - 1U || -1 < (long)local_68.false_positive_probability)) &&
      (1 < local_68.random_seed + 1)))) {
    this_00._M_head_impl = (Impl *)operator_new(0x68);
    bloom_filter::bloom_filter((bloom_filter *)this_00._M_head_impl,&local_68);
    ((this_00._M_head_impl)->super_bloom_filter)._vptr_bloom_filter = &PTR__bloom_filter_00123b90;
    _Var1._M_head_impl =
         (this->BloomFilter)._M_t.
         super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
         .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl;
    (this->BloomFilter)._M_t.
    super___uniq_ptr_impl<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_NJamSpell::TBloomFilter::Impl_*,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>
    .super__Head_base<0UL,_NJamSpell::TBloomFilter::Impl_*,_false>._M_head_impl =
         this_00._M_head_impl;
    if (_Var1._M_head_impl != (Impl *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_bloom_filter + 8))();
    }
    return;
  }
  __assert_fail("!(!parameters)",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/bloom_filter.cpp"
                ,0x25,"NJamSpell::TBloomFilter::TBloomFilter(uint64_t, double)");
}

Assistant:

TBloomFilter::TBloomFilter(uint64_t elements, double falsePositiveRate) {
    bloom_parameters parameters;
    parameters.projected_element_count = elements;
    parameters.false_positive_probability = falsePositiveRate;
    parameters.random_seed = 42;
    parameters.compute_optimal_parameters();
    assert(!(!parameters));
    BloomFilter.reset(new TBloomFilter::Impl(parameters));
}